

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void print_expr_struct_debug(lyxp_expr *exp)

{
  size_t *size_00;
  lyxp_expr_type *plVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  char *buf;
  size_t used;
  size_t size;
  char *local_50;
  lyxp_expr *local_48;
  size_t local_40 [2];
  
  local_50 = (char *)0x0;
  local_40[1] = 0;
  local_40[0] = 0;
  if (2 < ly_ll) {
    ly_log_dbg(2,"expression \"%s\":",exp->expr);
    pcVar2 = local_50;
    if (exp->used != 0) {
      size_00 = local_40 + 1;
      uVar3 = 0;
      local_48 = exp;
      do {
        pcVar2 = lyxp_token2str(exp->tokens[uVar3]);
        print_expr_str(&local_50,size_00,local_40,"\ttoken %s, in expression \"%.*s\"",pcVar2,
                       (ulong)exp->tok_len[uVar3],exp->expr + exp->tok_pos[uVar3]);
        if ((exp->repeat != (lyxp_expr_type **)0x0) &&
           (plVar1 = exp->repeat[uVar3], plVar1 != (lyxp_expr_type *)0x0)) {
          print_expr_str(&local_50,size_00,local_40," (repeat %d",(ulong)*plVar1);
          if (exp->repeat[uVar3][1] != LYXP_EXPR_NONE) {
            uVar4 = 2;
            do {
              print_expr_str(&local_50,size_00,local_40,", %d");
              plVar1 = local_48->repeat[uVar3] + uVar4;
              uVar4 = (ulong)((int)uVar4 + 1);
            } while (*plVar1 != LYXP_EXPR_NONE);
          }
          print_expr_str(&local_50,size_00,local_40,")");
          exp = local_48;
        }
        pcVar2 = local_50;
        ly_log_dbg(2,local_50);
        local_40[0] = 0;
        uVar3 = uVar3 + 1;
      } while (uVar3 < exp->used);
    }
    free(pcVar2);
    return;
  }
  return;
}

Assistant:

static void
print_expr_struct_debug(const struct lyxp_expr *exp)
{
    char *buf = NULL;
    uint32_t i, j;
    size_t size = 0, used = 0;

    if (!exp || (ly_ll < LY_LLDBG)) {
        return;
    }

    LOGDBG(LY_LDGXPATH, "expression \"%s\":", exp->expr);
    for (i = 0; i < exp->used; ++i) {
        print_expr_str(&buf, &size, &used, "\ttoken %s, in expression \"%.*s\"",
                lyxp_token2str(exp->tokens[i]), exp->tok_len[i], &exp->expr[exp->tok_pos[i]]);

        if (exp->repeat && exp->repeat[i]) {
            print_expr_str(&buf, &size, &used, " (repeat %d", exp->repeat[i][0]);
            for (j = 1; exp->repeat[i][j]; ++j) {
                print_expr_str(&buf, &size, &used, ", %d", exp->repeat[i][j]);
            }
            print_expr_str(&buf, &size, &used, ")");
        }
        LOGDBG(LY_LDGXPATH, buf);
        used = 0;
    }

    free(buf);
}